

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

int ON_Font::CompareFontCharacteristics(ON_Font *lhs,ON_Font *rhs)

{
  int iVar1;
  
  iVar1 = CompareFontCharacteristicsForExperts(false,false,lhs,rhs);
  return iVar1;
}

Assistant:

int ON_Font::CompareFontCharacteristics(
  const ON_Font& lhs,
  const ON_Font& rhs
)
{
  const bool bComparePlatformSpecificCharacteristics = true;
  const bool bIgnoreUnsetCharacteristics = false;
  return ON_Font::CompareFontCharacteristicsForExperts(
    bComparePlatformSpecificCharacteristics,
    bIgnoreUnsetCharacteristics,
    lhs,
    rhs
  );
}